

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O1

void __thiscall QThread::setServiceLevel(QThread *this,QualityOfService serviceLevel)

{
  __base_type copy;
  QThreadPrivate *this_00;
  QMutex *this_01;
  bool bVar1;
  
  this_00 = (QThreadPrivate *)(this->super_QObject).d_ptr.d;
  this_01 = &this_00->mutex;
  if ((this_00->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar1 = (this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar1) {
      (this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar1) goto LAB_003470ed;
  }
  QBasicMutex::lockInternal(&this_01->super_QBasicMutex);
LAB_003470ed:
  if (this_00->threadState == Running) {
    QThreadPrivate::setQualityOfServiceLevel(this_00,serviceLevel);
  }
  else {
    this_00->serviceLevel = serviceLevel;
  }
  LOCK();
  copy._M_p = (this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy._M_p != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(&this_01->super_QBasicMutex,copy._M_p);
    return;
  }
  return;
}

Assistant:

void QThread::setServiceLevel(QualityOfService serviceLevel)
{
    Q_D(QThread);
    QMutexLocker locker(&d->mutex);
    if (d->threadState != QThreadPrivate::Running) {
        d->serviceLevel = serviceLevel;
    } else {
        Q_ASSERT_X(isCurrentThread(), "QThread::setServiceLevel",
                "cannot change quality of service level of a separate, running, thread");
        d->setQualityOfServiceLevel(serviceLevel);
    }
}